

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Expression> __thiscall Parser::primary(Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  Parser *in_RSI;
  ptr<Expression> pVar3;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_40;
  ptr<Expression> expr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  bVar1 = match(in_RSI,Identifier);
  if (bVar1) {
    variable((Parser *)&expr);
    std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> *)&expr);
    postfix(this,(ptr<Expression> *)in_RSI);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&expr.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    bVar1 = match(in_RSI,LeftParen);
    if (bVar1) {
      consume(in_RSI,LeftParen,"\'(\'");
      expression(this);
      consume(in_RSI,RightParen,"\')\'");
      _Var2._M_pi = extraout_RDX_00;
    }
    else {
      pVar3 = value(this);
      _Var2 = pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
  }
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::primary() {
    if(match(TokenType::Identifier)) {
        ptr<Expression> expr = variable();
        return postfix(expr);
    } else if(match(TokenType::LeftParen)) {
        consume(TokenType::LeftParen, "'('");
        ptr<Expression> expr = expression();
        consume(TokenType::RightParen, "')'");
        return expr;
    } else {
        return value();
    }
}